

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testNNCompilerValidationBadProbBlob(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  DictionaryFeatureType *this;
  NeuralNetworkClassifier *this_00;
  StringVector *this_01;
  NeuralNetworkLayer *pNVar6;
  InnerProductLayerParams *pIVar7;
  ostream *poVar8;
  Model m1;
  Result res;
  string probsName;
  string featureName;
  
  CoreML::Specification::Model::Model(&m1);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,1);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pAVar5->datatype_ = 0x10020;
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"middle");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,1);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pAVar5->datatype_ = 0x10020;
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"features");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_stringtype(pFVar4);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"probs");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_dictionarytype(pFVar4);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  this = CoreML::Specification::FeatureType::mutable_dictionarytype(pFVar4);
  CoreML::Specification::DictionaryFeatureType::mutable_stringkeytype(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&featureName,"features",(allocator<char> *)&res);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  CoreML::Specification::ModelDescription::set_predictedfeaturename(pMVar2,&featureName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&probsName,"probs",(allocator<char> *)&res);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  CoreML::Specification::ModelDescription::set_predictedprobabilitiesname(pMVar2,&probsName);
  this_00 = CoreML::Specification::Model::mutable_neuralnetworkclassifier(&m1);
  this_01 = CoreML::Specification::NeuralNetworkClassifier::mutable_stringclasslabels(this_00);
  CoreML::Specification::StringVector::add_vector(this_01,"label1");
  CoreML::Specification::NeuralNetworkClassifier::set_labelprobabilitylayername(this_00,"not_here");
  pNVar6 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     (&this_00->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar6,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar6,"middle");
  pIVar7 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(pNVar6);
  pIVar7->hasbias_ = false;
  pNVar6 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     (&this_00->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar6,"middle");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar6,"output");
  pIVar7 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(pNVar6);
  pIVar7->hasbias_ = false;
  CoreML::validate<(MLModelType)403>(&res,&m1);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x456);
    poVar8 = std::operator<<(poVar8,": error: ");
    poVar8 = std::operator<<(poVar8,"!((res).good())");
    poVar8 = std::operator<<(poVar8," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  std::__cxx11::string::~string((string *)&probsName);
  std::__cxx11::string::~string((string *)&featureName);
  CoreML::Specification::Model::~Model(&m1);
  return (uint)bVar1;
}

Assistant:

int testNNCompilerValidationBadProbBlob() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    topIn->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT32);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("middle");
    auto *outshape = out->mutable_type()->mutable_multiarraytype();
    outshape->add_shape(1);
    out->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT32);

    auto *out2 = m1.mutable_description()->add_output();
    out2->set_name("features");
    out2->mutable_type()->mutable_stringtype();

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_dictionarytype();
    out3->mutable_type()->mutable_dictionarytype()->mutable_stringkeytype();

    std::string featureName = "features";
    m1.mutable_description()->set_predictedfeaturename(featureName);
    std::string probsName = "probs";
    m1.mutable_description()->set_predictedprobabilitiesname(probsName);


    const auto nn = m1.mutable_neuralnetworkclassifier();
    auto labels = nn->mutable_stringclasslabels();
    labels->add_vector("label1");
    nn->set_labelprobabilitylayername("not_here");

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input("input");
    innerProductLayer->add_output("middle");
    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_hasbias(false);

    Specification::NeuralNetworkLayer *innerProductLayer2 = nn->add_layers();
    innerProductLayer2->add_input("middle");
    innerProductLayer2->add_output("output");
    Specification::InnerProductLayerParams *innerProductParams2 = innerProductLayer2->mutable_innerproduct();
    innerProductParams2->set_hasbias(false);

    Result res = validate<MLModelType_neuralNetworkClassifier>(m1);
    ML_ASSERT_BAD(res);
    return 0;

}